

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::GetDefaultConfiguration_abi_cxx11_(string *__return_storage_ptr__,cmMakefile *this)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_BUILD_TYPE",&local_39);
    psVar2 = GetSafeDefinition(this,&local_38);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetDefaultConfiguration() const
{
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    return std::string{};
  }
  return this->GetSafeDefinition("CMAKE_BUILD_TYPE");
}